

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O1

void Eigen::internal::gemv_dense_selector<2,1,true>::
     run<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,_1,false>const>,Eigen::Transpose<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>const>const>,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::Stride<0,0>>>>
               (Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>_>
                *lhs,Transpose<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>_>
                     *rhs,
               Transpose<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>
               *dest,Scalar *alpha)

{
  ulong uVar1;
  PointerType pdVar2;
  XprTypeNested pMVar3;
  ResScalar *res;
  undefined8 *puVar4;
  const_blas_data_mapper<double,_long,_1> *pcVar5;
  long cols;
  long rows;
  PointerType __ptr;
  Scalar alpha_00;
  const_blas_data_mapper<double,_long,_1> local_68;
  const_blas_data_mapper<double,_long,_0> local_58;
  Scalar local_48;
  long local_40;
  long local_38;
  
  pcVar5 = &local_68;
  uVar1 = (rhs->m_matrix).m_matrix.
          super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
          .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>
          .m_rows.m_value;
  if (uVar1 >> 0x3d == 0) {
    pdVar2 = (lhs->m_matrix).
             super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
             .m_data;
    cols = (lhs->m_matrix).
           super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
           .m_rows.m_value;
    rows = (lhs->m_matrix).
           super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_0>
           .m_cols.m_value;
    pMVar3 = (lhs->m_matrix).
             super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false,_true>
             .m_xpr.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
             m_xpr;
    alpha_00 = *alpha;
    local_58.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data =
         (rhs->m_matrix).m_matrix.
         super_BlockImpl<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_Eigen::Dense>
         .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false,_true>.
         super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_0>
         .m_data;
    if (local_58.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data == (PointerType)0x0) {
      if (uVar1 < 0x4001) {
        local_58.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data =
             (double *)((long)&local_68 - (uVar1 * 8 + 0x1e & 0xfffffffffffffff0));
        pcVar5 = (const_blas_data_mapper<double,_long,_1> *)
                 local_58.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
        __ptr = local_58.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
      }
      else {
        local_48 = alpha_00;
        local_40 = cols;
        local_38 = rows;
        local_58.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data =
             (double *)malloc(uVar1 * 8);
        if (((ulong)local_58.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data & 0xf) != 0)
        {
          __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/util/Memory.h"
                        ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
        }
        cols = local_40;
        rows = local_38;
        __ptr = local_58.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data;
        alpha_00 = local_48;
        if (local_58.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data == (PointerType)0x0)
        goto LAB_00126fda;
      }
    }
    else {
      pcVar5 = &local_68;
      __ptr = (PointerType)0x0;
    }
    local_68.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_stride =
         (pMVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
    ;
    local_58.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride = 1;
    res = (dest->m_matrix).
          super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data;
    local_68.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_data = pdVar2;
    if ((res != (ResScalar *)0x0) &&
       ((dest->m_matrix).
        super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value < 0)) {
      *(undefined8 *)((long)pcVar5 + -8) = 0x127027;
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/MapBase.h"
                    ,0xb2,
                    "Eigen::MapBase<Eigen::Block<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double, 1, -1>>>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double, 1, -1>>>, -1, 1, true>, Level = 0]"
                   );
    }
    *(undefined8 *)((long)pcVar5 + -8) = 0x126fba;
    general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_1,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_false,_0>
    ::run(rows,cols,&local_68,&local_58,res,1,alpha_00);
    if (0x4000 < uVar1) {
      *(undefined8 *)((long)pcVar5 + -8) = 0x126fcb;
      free(__ptr);
    }
    return;
  }
LAB_00126fda:
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = operator_new;
  __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

static void run(const Lhs &lhs, const Rhs &rhs, Dest& dest, const typename Dest::Scalar& alpha)
  {
    typedef typename Lhs::Scalar   LhsScalar;
    typedef typename Rhs::Scalar   RhsScalar;
    typedef typename Dest::Scalar  ResScalar;
    
    typedef internal::blas_traits<Lhs> LhsBlasTraits;
    typedef typename LhsBlasTraits::DirectLinearAccessType ActualLhsType;
    typedef internal::blas_traits<Rhs> RhsBlasTraits;
    typedef typename RhsBlasTraits::DirectLinearAccessType ActualRhsType;
    typedef typename internal::remove_all<ActualRhsType>::type ActualRhsTypeCleaned;

    typename add_const<ActualLhsType>::type actualLhs = LhsBlasTraits::extract(lhs);
    typename add_const<ActualRhsType>::type actualRhs = RhsBlasTraits::extract(rhs);

    ResScalar actualAlpha = combine_scalar_factors(alpha, lhs, rhs);

    enum {
      // FIXME find a way to allow an inner stride on the result if packet_traits<Scalar>::size==1
      // on, the other hand it is good for the cache to pack the vector anyways...
      DirectlyUseRhs = ActualRhsTypeCleaned::InnerStrideAtCompileTime==1 || ActualRhsTypeCleaned::MaxSizeAtCompileTime==0
    };

    gemv_static_vector_if<RhsScalar,ActualRhsTypeCleaned::SizeAtCompileTime,ActualRhsTypeCleaned::MaxSizeAtCompileTime,!DirectlyUseRhs> static_rhs;

    ei_declare_aligned_stack_constructed_variable(RhsScalar,actualRhsPtr,actualRhs.size(),
        DirectlyUseRhs ? const_cast<RhsScalar*>(actualRhs.data()) : static_rhs.data());

    if(!DirectlyUseRhs)
    {
      #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      Index size = actualRhs.size();
      EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      #endif
      Map<typename ActualRhsTypeCleaned::PlainObject>(actualRhsPtr, actualRhs.size()) = actualRhs;
    }

    typedef const_blas_data_mapper<LhsScalar,Index,RowMajor> LhsMapper;
    typedef const_blas_data_mapper<RhsScalar,Index,ColMajor> RhsMapper;
    general_matrix_vector_product
        <Index,LhsScalar,LhsMapper,RowMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsMapper,RhsBlasTraits::NeedToConjugate>::run(
        actualLhs.rows(), actualLhs.cols(),
        LhsMapper(actualLhs.data(), actualLhs.outerStride()),
        RhsMapper(actualRhsPtr, 1),
        dest.data(), dest.col(0).innerStride(), //NOTE  if dest is not a vector at compile-time, then dest.innerStride() might be wrong. (bug 1166)
        actualAlpha);
  }